

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O3

char * search_i(Item *items,size_t len,int key)

{
  Item *pIVar1;
  
  if ((long)len < 1) {
    return (char *)0x0;
  }
  pIVar1 = items + len;
  do {
    if (items->key == key) {
      return items->value;
    }
    items = items + 1;
  } while (items < pIVar1);
  return (char *)0x0;
}

Assistant:

const char*
search_i(Item *items, size_t len, int key)
{
    Item *item;
    Item *end = items + len;
    for (item = items;item < end;item++) {
        if (item->key == key) {
            return item->value;
        }
    }
    return NULL;
}